

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void __thiscall
duckdb::
VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
::
Combine<duckdb::ArgMinMaxState<duckdb::string_t,long>,duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>>
          (VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
           *this,ArgMinMaxState<duckdb::string_t,_long> *source,
          ArgMinMaxState<duckdb::string_t,_long> *target,AggregateInputData *param_3)

{
  VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
  VVar1;
  long lVar2;
  string_t new_value;
  
  if (*this == (VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
                )0x1) {
    if ((source->super_ArgMinMaxStateBase).is_initialized == false) {
      lVar2 = *(long *)(this + 0x18);
    }
    else {
      lVar2 = *(long *)(this + 0x18);
      if (source->value <= lVar2) {
        return;
      }
    }
    source->value = lVar2;
    VVar1 = this[1];
    (source->super_ArgMinMaxStateBase).arg_null = (bool)VVar1;
    if (VVar1 == (VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
                  )0x0) {
      new_value.value.pointer.ptr = (char *)param_3;
      new_value.value._0_8_ = *(undefined8 *)(this + 0x10);
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)&source->arg,*(string_t **)(this + 8),new_value);
    }
    (source->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			STATE::template AssignValue<typename STATE::BY_TYPE>(target.value, source.value);
			target.arg_null = source.arg_null;
			if (!target.arg_null) {
				STATE::template AssignValue<typename STATE::ARG_TYPE>(target.arg, source.arg);
			}
			target.is_initialized = true;
		}
	}